

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O1

error parse_simple(char *start,char *end,atom *result)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  error eVar5;
  char *__ptr;
  char cVar6;
  anon_union_8_9_1d3277aa_for_value aVar7;
  anon_union_8_9_1d3277aa_for_value aVar8;
  undefined8 uVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  double dVar13;
  long lVar14;
  size_t sVar15;
  atom aVar16;
  atom car_val;
  atom car_val_00;
  atom car_val_01;
  atom car_val_02;
  atom car_val_03;
  atom cdr_val;
  atom cdr_val_00;
  atom cdr_val_01;
  atom a1;
  atom a2;
  char *p;
  atom local_58;
  atom local_48;
  char *local_38;
  
  dVar13 = strtod(start,&local_38);
  if (local_38 == end) {
    result->type = T_NUM;
    (result->value).number = dVar13;
  }
  else {
    if (*start == '#') {
      sVar15 = (long)end - (long)start;
      pcVar10 = (char *)malloc(sVar15 + 1);
      memcpy(pcVar10,start,sVar15);
      pcVar10[sVar15] = '\0';
      if ((sVar15 != 3) || (pcVar10[1] != '\\')) {
        iVar4 = strcmp(pcVar10,"#\\nul");
        if (iVar4 == 0) {
          dVar13 = 0.0;
        }
        else {
          iVar4 = strcmp(pcVar10,"#\\return");
          if (iVar4 == 0) {
            dVar13 = 6.42285339593621e-323;
          }
          else {
            iVar4 = strcmp(pcVar10,"#\\newline");
            if (iVar4 == 0) {
              dVar13 = 4.94065645841247e-323;
            }
            else {
              iVar4 = strcmp(pcVar10,"#\\tab");
              if (iVar4 == 0) {
                dVar13 = 4.44659081257122e-323;
              }
              else {
                iVar4 = strcmp(pcVar10,"#\\space");
                if (iVar4 != 0) {
                  free(pcVar10);
                  return ERROR_SYNTAX;
                }
                dVar13 = 1.58101006669199e-322;
              }
            }
          }
        }
        free(pcVar10);
        result->type = T_CHAR;
        (result->value).number = dVar13;
        return ERROR_OK;
      }
      aVar8._1_7_ = 0;
      aVar8.ch = pcVar10[2];
      result->type = T_CHAR;
      result->value = aVar8;
    }
    else {
      if (*start == '\"') {
        result->type = T_STRING;
        __ptr = (char *)malloc((size_t)(end + ~(ulong)start));
        pcVar1 = start + 1;
        pcVar10 = __ptr;
        while (pcVar12 = pcVar1, pcVar12 < end + -1) {
          cVar6 = start[1];
          if (cVar6 == '\\') {
            cVar6 = start[2];
            pcVar12 = start + 2;
            if (cVar6 == 't') {
              cVar6 = '\t';
            }
            else if (cVar6 == 'r') {
              cVar6 = '\r';
            }
            else if (cVar6 == 'n') {
              cVar6 = '\n';
            }
          }
          *pcVar10 = cVar6;
          pcVar10 = pcVar10 + 1;
          start = pcVar12;
          pcVar1 = pcVar12 + 1;
        }
        *pcVar10 = '\0';
        pcVar10 = (char *)realloc(__ptr,(size_t)(pcVar10 + (1 - (long)__ptr)));
        aVar16 = make_string(pcVar10);
        result->type = T_STRING;
        result->value = aVar16.value;
        return ERROR_OK;
      }
      sVar15 = (long)end - (long)start;
      pcVar10 = (char *)malloc(sVar15 + 1);
      memcpy(pcVar10,start,sVar15);
      pcVar10[sVar15] = '\0';
      iVar4 = strcmp(pcVar10,"nil");
      if (iVar4 == 0) {
        *(undefined8 *)result = 0;
        (result->value).number = 0.0;
      }
      else {
        iVar4 = strcmp(pcVar10,".");
        if (iVar4 == 0) {
          aVar16 = make_sym(pcVar10);
          result->type = T_SYM;
          result->value = aVar16.value;
        }
        else {
          pcVar1 = pcVar10 + sVar15;
          if (0 < (long)sVar15) {
            lVar14 = 0;
            do {
              cVar6 = pcVar1[lVar14 + -1];
              if (cVar6 == '!') {
                if ((lVar14 == 0 || sVar15 + lVar14 == 1) ||
                   (eVar5 = parse_simple(pcVar10,pcVar10 + sVar15 + lVar14 + -1,&local_58),
                   eVar5 != ERROR_OK)) {
LAB_00104ae6:
                  free(pcVar10);
                }
                else {
                  eVar5 = parse_simple(pcVar1 + lVar14,pcVar1,&local_48);
                  free(pcVar10);
                  if (eVar5 == ERROR_OK) {
                    aVar16._4_4_ = 0;
                    aVar16.type = local_48.type;
                    aVar16.value.number = local_48.value.number;
                    aVar16 = cons(aVar16,(atom)ZEXT816(0));
                    car_val_00._4_4_ = 0;
                    car_val_00.type = sym_quote.type;
                    car_val_00.value.number = sym_quote.value.number;
                    cdr_val_00.value.number = aVar16.value.number;
                    cdr_val_00._0_8_ = 1;
                    aVar16 = cons(car_val_00,cdr_val_00);
                    local_48.value = aVar16.value;
                    uVar11 = 1;
LAB_00104a8f:
                    car_val_01.value.number = local_48.value.number;
                    car_val_01._0_8_ = uVar11;
                    aVar16 = cons(car_val_01,(atom)ZEXT816(0));
                    aVar8 = aVar16.value;
                    uVar11 = (ulong)local_58.type;
                    goto LAB_00104aa3;
                  }
                }
LAB_00104aee:
                sVar15 = 1;
                goto LAB_00104af4;
              }
              if (cVar6 == ':') {
                if ((lVar14 == 0 || sVar15 + lVar14 == 1) ||
                   (eVar5 = parse_simple(pcVar10,pcVar10 + sVar15 + lVar14 + -1,&local_58),
                   eVar5 != ERROR_OK)) goto LAB_00104ae6;
                eVar5 = parse_simple(pcVar1 + lVar14,pcVar1,&local_48);
                free(pcVar10);
                if (eVar5 != ERROR_OK) goto LAB_00104aee;
                aVar16 = make_sym("compose");
                aVar7 = aVar16.value;
                car_val_03._4_4_ = 0;
                car_val_03.type = local_48.type;
                car_val_03.value.number = local_48.value.number;
                aVar16 = cons(car_val_03,(atom)ZEXT816(0));
                aVar8 = aVar16.value;
                uVar9 = 1;
                goto LAB_0010489c;
              }
              if (cVar6 == '.') {
                if ((lVar14 == 0 || sVar15 + lVar14 == 1) ||
                   (eVar5 = parse_simple(pcVar10,pcVar10 + sVar15 + lVar14 + -1,&local_58),
                   eVar5 != ERROR_OK)) goto LAB_00104ae6;
                eVar5 = parse_simple(pcVar1 + lVar14,pcVar1,&local_48);
                free(pcVar10);
                if (eVar5 == ERROR_OK) {
                  uVar11 = (ulong)local_48.type;
                  goto LAB_00104a8f;
                }
                goto LAB_00104aee;
              }
              lVar2 = sVar15 + lVar14;
              lVar14 = lVar14 + -1;
            } while (lVar2 != 1 && -1 < lVar2 + -1);
          }
          if (((long)sVar15 < 2) || (*pcVar10 != '~')) {
            aVar16 = make_sym(pcVar10);
            result->type = T_SYM;
            result->value = aVar16.value;
            bVar3 = true;
          }
          else {
            eVar5 = parse_simple(pcVar10 + 1,pcVar1,&local_58);
            free(pcVar10);
            sVar15 = 1;
            if (eVar5 == ERROR_OK) {
              aVar16 = make_sym("complement");
              aVar7 = aVar16.value;
              uVar9 = 0;
              aVar8.number = 0.0;
LAB_0010489c:
              car_val._4_4_ = 0;
              car_val.type = local_58.type;
              car_val.value.number = local_58.value.number;
              cdr_val.value.number = aVar8.number;
              cdr_val._0_8_ = uVar9;
              aVar16 = cons(car_val,cdr_val);
              aVar8 = aVar16.value;
              uVar11 = 2;
              local_58.value = aVar7;
LAB_00104aa3:
              sVar15 = 0;
              car_val_02.value.number = local_58.value.number;
              car_val_02._0_8_ = uVar11;
              cdr_val_01.value.number = aVar8.number;
              cdr_val_01._0_8_ = 1;
              aVar16 = cons(car_val_02,cdr_val_01);
              result->type = T_CONS;
              result->value = aVar16.value;
            }
LAB_00104af4:
            bVar3 = false;
          }
          if (!bVar3) {
            return (error)sVar15;
          }
        }
      }
    }
    free(pcVar10);
  }
  return ERROR_OK;
}

Assistant:

error parse_simple(const char *start, const char *end, atom *result)
{
	char *p;

	/* Is it a number? */
	double val = strtod(start, &p);
	if (p == end) {
		result->type = T_NUM;
		result->value.number = val;
		return ERROR_OK;
	}
	else if (start[0] == '"') { /* "string" */
		result->type = T_STRING;
		size_t length = end - start - 2;
		char *buf = (char*)malloc(length + 1);
		const char *ps = start + 1;
		char *pt = buf;
		while (ps < end - 1) {
			if (*ps == '\\') {
				char c_next = *(ps + 1);
				switch (c_next) {
				case 'r':
					*pt = '\r';
					break;
				case 'n':
					*pt = '\n';
					break;
				case 't':
					*pt = '\t';
					break;
				default:
					*pt = c_next;
				}
				ps++;
			}
			else {
				*pt = *ps;
			}
			ps++;
			pt++;
		}
		*pt = 0;
		buf = realloc(buf, pt - buf + 1);
		*result = make_string(buf);
		return ERROR_OK;
	}
	else if (start[0] == '#') { /* #\char */
		char *buf = malloc(end - start + 1);
		memcpy(buf, start, end - start);
		buf[end - start] = 0;
		size_t length = end - start;
		if (length == 3 && buf[1] == '\\') { /* plain character e.g. #\a */
			*result = make_char(buf[2]);
			free(buf);
			return ERROR_OK;
		}
		else {
			char c;
			if (strcmp(buf, "#\\nul") == 0)
				c = '\0';
			else if (strcmp(buf, "#\\return") == 0)
				c = '\r';
			else if (strcmp(buf, "#\\newline") == 0)
				c = '\n';
			else if (strcmp(buf, "#\\tab") == 0)
				c = '\t';
			else if (strcmp(buf, "#\\space") == 0)
				c = ' ';
			else {
				free(buf);
				return ERROR_SYNTAX;
			}
			free(buf);
			*result = make_char(c);
			return ERROR_OK;
		}
	}

	/* NIL or symbol */
	char *buf = malloc(end - start + 1);
	memcpy(buf, start, end - start);
	buf[end - start] = 0;

	if (strcmp(buf, "nil") == 0)
		*result = nil;
	else if (strcmp(buf, ".") == 0)
		*result = make_sym(buf);
	else {
		atom a1, a2;
		long length = end - start, i;
		for (i = length - 1; i >= 0; i--) { /* left-associative */
			if (buf[i] == '.') { /* a.b => (a b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(a1, cons(a2, nil));
				return ERROR_OK;
			}
			else if (buf[i] == '!') { /* a!b => (a 'b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(a1, cons(cons(sym_quote, cons(a2, nil)), nil));
				return ERROR_OK;
			}
			else if (buf[i] == ':') { /* a:b => (compose a b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(make_sym("compose"), cons(a1, cons(a2, nil)));
				return ERROR_OK;
			}
		}
		if (length >= 2 && buf[0] == '~') { /* ~a => (complement a) */
			atom a1;
			error err = parse_simple(buf + 1, buf + length, &a1);
			free(buf);
			if (err) {
				return ERROR_SYNTAX;
			}
			*result = cons(make_sym("complement"), cons(a1, nil));
			return ERROR_OK;
		}
		*result = make_sym(buf);
	}

	free(buf);
	return ERROR_OK;
}